

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

Quat<float> __thiscall Imath_2_5::extractQuat<float>(Imath_2_5 *this,Matrix44<float> *mat)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  Quat<float> QVar12;
  float q [4];
  
  fVar11 = mat->x[0][0];
  fVar2 = mat->x[1][1];
  fVar3 = mat->x[2][2];
  fVar10 = fVar11 + fVar2 + fVar3;
  if (fVar10 <= 0.0) {
    bVar4 = fVar11 < fVar2;
    pfVar1 = mat->x[bVar4] + bVar4;
    uVar8 = 2;
    if (fVar3 < *pfVar1 || fVar3 == *pfVar1) {
      uVar8 = (uint)bVar4;
    }
    lVar6 = (long)*(int *)(&DAT_0014c9d4 + uVar8 * 4);
    lVar5 = (long)*(int *)(&DAT_0014c9d4 + lVar6 * 4);
    uVar7 = uVar8 << 4;
    fVar11 = (*(float *)((long)mat->x[0] + (ulong)(uVar8 * 4) + (ulong)uVar7) -
             (*(float *)((long)mat->x + lVar6 * 0x14) + *(float *)((long)mat->x + lVar5 * 0x14))) +
             1.0;
    if (fVar11 < 0.0) {
      fVar11 = sqrtf(fVar11);
    }
    else {
      fVar11 = SQRT(fVar11);
    }
    uVar9 = (ulong)(uVar8 << 2);
    *(float *)((long)q + uVar9) = fVar11 * 0.5;
    fVar11 = (float)(~-(uint)(fVar11 != 0.0) & (uint)fVar11 |
                    (uint)(0.5 / fVar11) & -(uint)(fVar11 != 0.0));
    q[3] = (mat->x[lVar6][lVar5] - mat->x[lVar5][lVar6]) * fVar11;
    q[lVar6] = (*(float *)((long)mat->x[0] + lVar6 * 4 + (ulong)uVar7) +
               *(float *)((long)mat->x[lVar6] + uVar9)) * fVar11;
    q[lVar5] = (*(float *)((long)mat->x[0] + lVar5 * 4 + (ulong)uVar7) +
               *(float *)((long)mat->x[lVar5] + uVar9)) * fVar11;
    fVar11 = (float)q._0_8_;
    fVar10 = SUB84(q._0_8_,4);
    *(float *)this = q[3];
  }
  else {
    fVar10 = fVar10 + 1.0;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    *(float *)this = fVar10 * 0.5;
    fVar10 = 0.5 / fVar10;
    q[2] = (mat->x[0][1] - mat->x[1][0]) * fVar10;
    fVar11 = fVar10 * (mat->x[1][2] - mat->x[2][1]);
    fVar10 = fVar10 * (mat->x[2][0] - mat->x[0][2]);
  }
  QVar12.v.x = 0.0;
  QVar12.r = q[2];
  *(ulong *)(this + 4) = CONCAT44(fVar10,fVar11);
  *(float *)(this + 0xc) = q[2];
  QVar12.v.z = fVar10;
  QVar12.v.y = fVar11;
  return QVar12;
}

Assistant:

Quat<T>
extractQuat (const Matrix44<T> &mat)
{
  Matrix44<T> rot;

  T        tr, s;
  T         q[4];
  int    i, j, k;
  Quat<T>   quat;

  int nxt[3] = {1, 2, 0};
  tr = mat[0][0] + mat[1][1] + mat[2][2];

  // check the diagonal
  if (tr > 0.0) {
     s = Math<T>::sqrt (tr + T(1.0));
     quat.r = s / T(2.0);
     s = T(0.5) / s;

     quat.v.x = (mat[1][2] - mat[2][1]) * s;
     quat.v.y = (mat[2][0] - mat[0][2]) * s;
     quat.v.z = (mat[0][1] - mat[1][0]) * s;
  } 
  else {      
     // diagonal is negative
     i = 0;
     if (mat[1][1] > mat[0][0]) 
        i=1;
     if (mat[2][2] > mat[i][i]) 
        i=2;
    
     j = nxt[i];
     k = nxt[j];
     s = Math<T>::sqrt ((mat[i][i] - (mat[j][j] + mat[k][k])) + T(1.0));
      
     q[i] = s * T(0.5);
     if (s != T(0.0)) 
        s = T(0.5) / s;

     q[3] = (mat[j][k] - mat[k][j]) * s;
     q[j] = (mat[i][j] + mat[j][i]) * s;
     q[k] = (mat[i][k] + mat[k][i]) * s;

     quat.v.x = q[0];
     quat.v.y = q[1];
     quat.v.z = q[2];
     quat.r = q[3];
 }

  return quat;
}